

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Emu.cpp
# Opt level: O0

void __thiscall Ay_Emu::Ay_Emu(Ay_Emu *this)

{
  Music_Emu *pMVar1;
  Classic_Emu *in_RDI;
  Ay_Apu *unaff_retaddr;
  
  Ay_Cpu::Ay_Cpu((Ay_Cpu *)(in_RDI + 1));
  Classic_Emu::Classic_Emu(in_RDI);
  (in_RDI->super_Music_Emu).super_Gme_File._vptr_Gme_File = (_func_int **)&PTR__Ay_Emu_00a100d0;
  Ay_Apu::Ay_Apu(unaff_retaddr);
  pMVar1 = &in_RDI[2].super_Music_Emu;
  (pMVar1->super_Gme_File).playlist_warning[0x18] = '\0';
  (pMVar1->super_Gme_File).playlist_warning[0x19] = '\0';
  (pMVar1->super_Gme_File).playlist_warning[0x1a] = '\0';
  (pMVar1->super_Gme_File).playlist_warning[0x1b] = '\0';
  (pMVar1->super_Gme_File).playlist_warning[0x1c] = '\0';
  (pMVar1->super_Gme_File).playlist_warning[0x1d] = '\0';
  (pMVar1->super_Gme_File).playlist_warning[0x1e] = '\0';
  (pMVar1->super_Gme_File).playlist_warning[0x1f] = '\0';
  Gme_File::set_type((Gme_File *)in_RDI,&gme_ay_type_);
  Music_Emu::set_voice_names(&in_RDI->super_Music_Emu,Ay_Emu::names);
  Classic_Emu::set_voice_types(in_RDI,Ay_Emu::types);
  Music_Emu::set_silence_lookahead(&in_RDI->super_Music_Emu,6);
  return;
}

Assistant:

Ay_Emu::Ay_Emu()
{
	beeper_output = 0;
	set_type( gme_ay_type );
	
	static const char* const names [osc_count] = {
		"Wave 1", "Wave 2", "Wave 3", "Beeper"
	};
	set_voice_names( names );
	
	static int const types [osc_count] = {
		wave_type | 0, wave_type | 1, wave_type | 2, mixed_type | 0
	};
	set_voice_types( types );
	set_silence_lookahead( 6 );
}